

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O0

void __thiscall CMakeScanner::SetInputFile(CMakeScanner *this,string *path)

{
  char *__filename;
  FILE *pFVar1;
  runtime_error *this_00;
  string local_70;
  allocator<char> local_39;
  string local_38 [8];
  string error;
  string *path_local;
  CMakeScanner *this_local;
  
  error.field_2._8_8_ = path;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"rb");
  this->file = (FILE *)pFVar1;
  if (this->file == (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Cannot open file ",&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::__cxx11::string::operator+=(local_38,(string *)error.field_2._8_8_);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_70,(string *)error.field_2._8_8_);
  ScannerCtx::SetInputFile(&this->scannerCtx,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  yyset_in(this->file,this->yyscanner);
  return;
}

Assistant:

void SetInputFile(const std::string& path)
    {
        file = fopen(path.c_str(), "rb");
        if(!file)
        {
            std::string error{"Cannot open file "};
            error += path;
            throw std::runtime_error{error};
        }
        scannerCtx.SetInputFile(path);
        yyset_in(file, yyscanner);
    }